

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_casts.cpp
# Opt level: O2

unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true> __thiscall
duckdb::UnionUnionBoundCastData::Copy(UnionUnionBoundCastData *this)

{
  BoundCastInfo *pBVar1;
  long in_RSI;
  BoundCastInfo *this_00;
  vector<duckdb::BoundCastInfo,_true> member_casts_copy;
  BoundCastInfo local_60;
  vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_> local_48;
  
  local_48.super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  pBVar1 = *(BoundCastInfo **)(in_RSI + 0x28);
  for (this_00 = *(BoundCastInfo **)(in_RSI + 0x20); this_00 != pBVar1; this_00 = this_00 + 1) {
    BoundCastInfo::Copy(&local_60,this_00);
    ::std::vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>::
    emplace_back<duckdb::BoundCastInfo>(&local_48,&local_60);
    if (local_60.cast_data.
        super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
        super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
        .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true,_true>
         )0x0) {
      (*(*(_func_int ***)
          local_60.cast_data.
          super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
          super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
          .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl)[1])();
    }
  }
  make_uniq<duckdb::UnionUnionBoundCastData,duckdb::vector<unsigned_long,true>const&,duckdb::vector<duckdb::BoundCastInfo,true>,duckdb::LogicalType_const&>
            ((duckdb *)&local_60,(vector<unsigned_long,_true> *)(in_RSI + 8),
             (vector<duckdb::BoundCastInfo,_true> *)&local_48,(LogicalType *)(in_RSI + 0x38));
  (this->super_BoundCastData)._vptr_BoundCastData = (_func_int **)local_60.function;
  ::std::vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>::~vector(&local_48);
  return (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
         (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)this;
}

Assistant:

unique_ptr<BoundCastData> Copy() const override {
		vector<BoundCastInfo> member_casts_copy;
		for (auto &member_cast : member_casts) {
			member_casts_copy.push_back(member_cast.Copy());
		}
		return make_uniq<UnionUnionBoundCastData>(tag_map, std::move(member_casts_copy), target_type);
	}